

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_random.cpp
# Opt level: O2

void __thiscall BamTools::RandomTool::RandomTool(RandomTool *this)

{
  RandomSettings *pRVar1;
  OptionGroup *pOVar2;
  string *psVar3;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__RandomTool_0019e160;
  pRVar1 = (RandomSettings *)operator_new(0x90);
  RandomSettings::RandomSettings(pRVar1);
  this->m_settings = pRVar1;
  this->m_impl = (RandomToolPrivate *)0x0;
  std::__cxx11::string::string((string *)&local_98,"bamtools random",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"grab a random subset of alignments",&local_9b);
  std::__cxx11::string::string
            ((string *)&local_58,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename>] [-forceCompression] [-n] [-region <REGION>]"
             ,&local_9c);
  Options::SetProgramInfo(&local_98,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"Input & Output",(allocator *)&local_78);
  pOVar2 = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-in",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"BAM filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"the input BAM file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  pRVar1 = this->m_settings;
  psVar3 = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&local_98,&local_78,&local_58,&local_38,&pRVar1->HasInput,&pRVar1->InputFiles,pOVar2,
             psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-list",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"filename",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,"the input BAM file list, one line per file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-out",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"BAM filename",&local_9c);
  std::__cxx11::string::string((string *)&local_58,"the output BAM file",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  pRVar1 = this->m_settings;
  psVar3 = Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_98,&local_78,&local_58,&local_38,&pRVar1->HasOutput,&pRVar1->OutputFilename,
             pOVar2,psVar3);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-region",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"REGION",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,
             "only pull random alignments from within this genomic region. Index file is recommended for better performance, and is used automatically if it exists. See \'bamtools help index\' for more details on creating one"
             ,&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<std::__cxx11::string>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasRegion,
             &this->m_settings->Region,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-forceCompression",(allocator *)&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,(allocator *)&local_38);
  Options::AddOption(&local_98,&local_78,&this->m_settings->IsForceCompression,pOVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"Settings",(allocator *)&local_78);
  pOVar2 = Options::CreateOptionGroup(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-n",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"count",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,
             "number of alignments to grab. Note - no duplicate checking is performed",&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<unsigned_int,unsigned_int_const>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasAlignmentCount,
             &this->m_settings->AlignmentCount,pOVar2,&RANDOM_MAX_ALIGNMENT_COUNT);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"-seed",&local_9b);
  std::__cxx11::string::string((string *)&local_78,"unsigned integer",&local_9c);
  std::__cxx11::string::string
            ((string *)&local_58,
             "random number generator seed (for repeatable results). Current time is used if no seed value is provided."
             ,&local_99);
  std::__cxx11::string::string((string *)&local_38,"",&local_9a);
  Options::AddValueOption<unsigned_int>
            (&local_98,&local_78,&local_58,&local_38,&this->m_settings->HasRandomNumberSeed,
             &this->m_settings->RandomNumberSeed,pOVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

RandomTool::RandomTool()
    : AbstractTool()
    , m_settings(new RandomSettings)
    , m_impl(0)
{
    // set program details
    Options::SetProgramInfo("bamtools random", "grab a random subset of alignments",
                            "[-in <filename> -in <filename> ... | -list <filelist>] [-out "
                            "<filename>] [-forceCompression] [-n] [-region <REGION>]");

    // set up options
    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");
    Options::AddValueOption("-in", "BAM filename", "the input BAM file", "", m_settings->HasInput,
                            m_settings->InputFiles, IO_Opts, Options::StandardIn());
    Options::AddValueOption("-list", "filename", "the input BAM file list, one line per file", "",
                            m_settings->HasInputFilelist, m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", "the output BAM file", "",
                            m_settings->HasOutput, m_settings->OutputFilename, IO_Opts,
                            Options::StandardOut());
    Options::AddValueOption("-region", "REGION",
                            "only pull random alignments from within this genomic region. Index "
                            "file is recommended for better performance, and is used automatically "
                            "if it exists. See \'bamtools help index\' for more details on "
                            "creating one",
                            "", m_settings->HasRegion, m_settings->Region, IO_Opts);
    Options::AddOption("-forceCompression",
                       "if results are sent to stdout (like when piping to another tool), default "
                       "behavior is to leave output uncompressed. Use this flag to override and "
                       "force compression",
                       m_settings->IsForceCompression, IO_Opts);

    OptionGroup* SettingsOpts = Options::CreateOptionGroup("Settings");
    Options::AddValueOption(
        "-n", "count", "number of alignments to grab. Note - no duplicate checking is performed",
        "", m_settings->HasAlignmentCount, m_settings->AlignmentCount, SettingsOpts,
        RANDOM_MAX_ALIGNMENT_COUNT);
    Options::AddValueOption("-seed", "unsigned integer",
                            "random number generator seed (for repeatable results). Current time "
                            "is used if no seed value is provided.",
                            "", m_settings->HasRandomNumberSeed, m_settings->RandomNumberSeed,
                            SettingsOpts);
}